

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_IPv6address(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  size_t sVar2;
  curi_status cVar3;
  curi_status __TRY_tryStatus_3;
  size_t __TRY_initialOffset_3;
  curi_status __TRY_tryStatus_2;
  size_t __TRY_initialOffset_2;
  size_t i_1;
  curi_status tryStatus_1;
  size_t initialOffset_1;
  curi_status __TRY_tryStatus_1;
  size_t __TRY_initialOffset_1;
  size_t i;
  curi_status __TRY_tryStatus;
  size_t __TRY_initialOffset;
  curi_status tryStatus;
  size_t initialOffset;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  initialOffset._4_4_ = curi_status_success;
  sVar1 = *offset;
  __TRY_initialOffset._4_4_ = curi_status_error;
  sVar2 = *offset;
  cVar3 = parse_char(':',uri,len,offset,settings,userData);
  if (cVar3 == curi_status_error) {
    *offset = sVar2;
    cVar3 = __TRY_initialOffset._4_4_;
  }
  __TRY_initialOffset._4_4_ = cVar3;
  if (__TRY_initialOffset._4_4_ == curi_status_error) {
    __TRY_initialOffset._4_4_ = parse_h16_and_colon(uri,len,offset,settings,userData);
    for (__TRY_initialOffset_1 = 0; __TRY_initialOffset_1 < 6;
        __TRY_initialOffset_1 = __TRY_initialOffset_1 + 1) {
      sVar2 = *offset;
      cVar3 = parse_h16_and_colon(uri,len,offset,settings,userData);
      if (cVar3 == curi_status_error) {
        *offset = sVar2;
        cVar3 = __TRY_initialOffset._4_4_;
      }
      __TRY_initialOffset._4_4_ = cVar3;
    }
  }
  if (__TRY_initialOffset._4_4_ == curi_status_success) {
    __TRY_initialOffset._4_4_ = parse_char(':',uri,len,offset,settings,userData);
  }
  if (__TRY_initialOffset._4_4_ == curi_status_error) {
    *offset = sVar1;
  }
  else {
    initialOffset._4_4_ = __TRY_initialOffset._4_4_;
  }
  cVar3 = initialOffset._4_4_;
  if (initialOffset._4_4_ == curi_status_success) {
    initialOffset._4_4_ = curi_status_error;
    sVar1 = *offset;
    i_1._4_4_ = curi_status_success;
    for (__TRY_initialOffset_2 = 0; __TRY_initialOffset_2 < 6;
        __TRY_initialOffset_2 = __TRY_initialOffset_2 + 1) {
      sVar2 = *offset;
      cVar3 = parse_h16_and_colon(uri,len,offset,settings,userData);
      if (cVar3 == curi_status_error) {
        *offset = sVar2;
        cVar3 = i_1._4_4_;
      }
      i_1._4_4_ = cVar3;
    }
    if (i_1._4_4_ == curi_status_success) {
      i_1._4_4_ = parse_ls32(uri,len,offset,settings,userData);
    }
    if (i_1._4_4_ == curi_status_error) {
      *offset = sVar1;
    }
    else {
      initialOffset._4_4_ = i_1._4_4_;
    }
    cVar3 = initialOffset._4_4_;
    if (initialOffset._4_4_ == curi_status_error) {
      sVar1 = *offset;
      cVar3 = parse_h16(uri,len,offset,settings,userData);
      if (cVar3 == curi_status_error) {
        *offset = sVar1;
        cVar3 = initialOffset._4_4_;
      }
    }
  }
  initialOffset._4_4_ = cVar3;
  return initialOffset._4_4_;
}

Assistant:

static curi_status parse_IPv6address(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // IPv6address =                            6( h16 ":" ) ls32
    //             /                       "::" 5( h16 ":" ) ls32
    //             / [               h16 ] "::" 4( h16 ":" ) ls32
    //             / [ *1( h16 ":" ) h16 ] "::" 3( h16 ":" ) ls32
    //             / [ *2( h16 ":" ) h16 ] "::" 2( h16 ":" ) ls32
    //             / [ *3( h16 ":" ) h16 ] "::"    h16 ":"   ls32
    //             / [ *4( h16 ":" ) h16 ] "::"              ls32
    //             / [ *5( h16 ":" ) h16 ] "::"              h16
    //             / [ *6( h16 ":" ) h16 ] "::"

    // Let's simplify it to [ (":" / 1*7(h16_and_colon)) ":"] ( (0*6(h16_and_colon) ls32) / h16 )

    curi_status status = curi_status_success;

    if (status == curi_status_success)
    {
        size_t initialOffset = *offset;
        curi_status tryStatus = curi_status_error;

        if (tryStatus == curi_status_error)
            TRY(tryStatus,offset,parse_char(':', uri, len, offset, settings, userData));

        if (tryStatus == curi_status_error)
        {
            size_t i;
            tryStatus = curi_status_success;

            if (tryStatus == curi_status_success)
                tryStatus = parse_h16_and_colon(uri, len, offset, settings, userData);

            for (i = 0 ; i < 6 ; ++i)
                TRY(tryStatus,offset,parse_h16_and_colon(uri, len, offset, settings, userData));
        }

        if (tryStatus == curi_status_success)
            tryStatus = parse_char(':', uri, len, offset, settings, userData);

        if (tryStatus == curi_status_error)
            *offset = initialOffset;
        else
            status = tryStatus;
    }

    if (status == curi_status_success)
    {
        status = curi_status_error;

        if (status == curi_status_error)
        {
            size_t initialOffset = *offset;
            curi_status tryStatus = curi_status_success;
            size_t i;
            for (i = 0 ; i < 6 ; ++i)
                TRY(tryStatus,offset,parse_h16_and_colon(uri, len, offset, settings, userData));

            if (tryStatus == curi_status_success)
                tryStatus = parse_ls32(uri, len, offset, settings, userData);

            if (tryStatus == curi_status_error)
                *offset = initialOffset;
            else
                status = tryStatus;
        }

        if (status == curi_status_error)
            TRY(status,offset,parse_h16(uri, len, offset, settings, userData));
    }

    return status;
}